

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5RowidMethod(sqlite3_vtab_cursor *pCursor,sqlite_int64 *pRowid)

{
  int iVar1;
  i64 iVar2;
  sqlite3_int64 sVar3;
  int ePlan;
  Fts5Cursor *pCsr;
  sqlite_int64 *pRowid_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  iVar1 = *(int *)&pCursor[4].pVtab;
  if (1 < iVar1 - 1U) {
    if (iVar1 == 3) {
      *pRowid = 0;
      return 0;
    }
    if (iVar1 != 4) {
      sVar3 = sqlite3_column_int64((sqlite3_stmt *)pCursor[7].pVtab,0);
      *pRowid = sVar3;
      return 0;
    }
  }
  iVar2 = fts5CursorRowid((Fts5Cursor *)pCursor);
  *pRowid = iVar2;
  return 0;
}

Assistant:

static int fts5RowidMethod(sqlite3_vtab_cursor *pCursor, sqlite_int64 *pRowid){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int ePlan = pCsr->ePlan;
  
  assert( CsrFlagTest(pCsr, FTS5CSR_EOF)==0 );
  switch( ePlan ){
    case FTS5_PLAN_SPECIAL:
      *pRowid = 0;
      break;

    case FTS5_PLAN_SOURCE:
    case FTS5_PLAN_MATCH:
    case FTS5_PLAN_SORTED_MATCH:
      *pRowid = fts5CursorRowid(pCsr);
      break;

    default:
      *pRowid = sqlite3_column_int64(pCsr->pStmt, 0);
      break;
  }

  return SQLITE_OK;
}